

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_blob64(sqlite3_context *pCtx,void *z,sqlite3_uint64 n,_func_void_void_ptr *xDel)

{
  _func_void_void_ptr *xDel_local;
  sqlite3_uint64 n_local;
  void *z_local;
  sqlite3_context *pCtx_local;
  
  if (n < 0x80000000) {
    setResultStrOrError(pCtx,(char *)z,(int)n,'\0',xDel);
  }
  else {
    invokeValueDestructor(z,xDel,pCtx);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_blob64(
  sqlite3_context *pCtx, 
  const void *z, 
  sqlite3_uint64 n,
  void (*xDel)(void *)
){
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  assert( xDel!=SQLITE_DYNAMIC );
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, 0, xDel);
  }
}